

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_pubkey_cmp(secp256k1_context *ctx,secp256k1_pubkey *pk0,secp256k1_pubkey *pk1)

{
  long lVar1;
  int iVar2;
  secp256k1_pubkey **ppsVar3;
  long lVar4;
  bool bVar5;
  byte *pbVar6;
  bool bVar7;
  size_t outputlen;
  uchar out [2] [33];
  size_t local_90;
  secp256k1_pubkey *local_88;
  secp256k1_pubkey *local_80;
  byte local_78 [32];
  byte local_58 [40];
  
  local_88 = pk0;
  local_80 = pk1;
  ppsVar3 = &local_88;
  pbVar6 = local_78;
  bVar7 = true;
  do {
    bVar5 = bVar7;
    local_90 = 0x21;
    iVar2 = secp256k1_ec_pubkey_serialize(ctx,pbVar6,&local_90,*ppsVar3,0x102);
    if (iVar2 == 0) {
      pbVar6[0x10] = 0;
      pbVar6[0x11] = 0;
      pbVar6[0x12] = 0;
      pbVar6[0x13] = 0;
      pbVar6[0x14] = 0;
      pbVar6[0x15] = 0;
      pbVar6[0x16] = 0;
      pbVar6[0x17] = 0;
      pbVar6[0x18] = 0;
      pbVar6[0x19] = 0;
      pbVar6[0x1a] = 0;
      pbVar6[0x1b] = 0;
      pbVar6[0x1c] = 0;
      pbVar6[0x1d] = 0;
      pbVar6[0x1e] = 0;
      pbVar6[0x1f] = 0;
      pbVar6[0] = 0;
      pbVar6[1] = 0;
      pbVar6[2] = 0;
      pbVar6[3] = 0;
      pbVar6[4] = 0;
      pbVar6[5] = 0;
      pbVar6[6] = 0;
      pbVar6[7] = 0;
      pbVar6[8] = 0;
      pbVar6[9] = 0;
      pbVar6[10] = 0;
      pbVar6[0xb] = 0;
      pbVar6[0xc] = 0;
      pbVar6[0xd] = 0;
      pbVar6[0xe] = 0;
      pbVar6[0xf] = 0;
      pbVar6[0x20] = 0;
    }
    ppsVar3 = &local_80;
    pbVar6 = local_58 + 1;
    bVar7 = false;
  } while (bVar5);
  lVar4 = 0;
  do {
    pbVar6 = local_78 + lVar4;
    lVar1 = lVar4 + 1;
    if (*pbVar6 != local_58[lVar1]) break;
    bVar7 = lVar4 != 0x20;
    lVar4 = lVar4 + 1;
  } while (bVar7);
  return (uint)*pbVar6 - (uint)local_58[lVar1];
}

Assistant:

int secp256k1_pubkey_cmp(const secp256k1_context* ctx, const secp256k1_pubkey* pk0, const secp256k1_pubkey* pk1) {
    unsigned char out[2][33];
    const secp256k1_pubkey* pk[2];
    int i;

    VERIFY_CHECK(ctx != NULL);
    pk[0] = pk0; pk[1] = pk1;
    for (i = 0; i < 2; i++) {
        size_t outputlen = sizeof(out[i]);
        /* If the public key is NULL or invalid, pubkey_serialize will
         * call the illegal_callback and return 0. In that case we will
         * serialize the key as all zeros which is less than any valid public
         * key. This results in consistent comparisons even if NULL or invalid
         * pubkeys are involved and prevents edge cases such as sorting
         * algorithms that use this function and do not terminate as a
         * result. */
        if (!secp256k1_ec_pubkey_serialize(ctx, out[i], &outputlen, pk[i], SECP256K1_EC_COMPRESSED)) {
            /* Note that pubkey_serialize should already set the output to
             * zero in that case, but it's not guaranteed by the API, we can't
             * test it and writing a VERIFY_CHECK is more complex than
             * explicitly memsetting (again). */
            memset(out[i], 0, sizeof(out[i]));
        }
    }
    return secp256k1_memcmp_var(out[0], out[1], sizeof(out[1]));
}